

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O3

void duckdb::BitwiseNOTOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  data_ptr_t pdVar5;
  reference vector;
  TemplatedValidityData<unsigned_long> *pTVar6;
  _Head_base<0UL,_unsigned_long_*,_false> _Var7;
  idx_t iVar8;
  idx_t extraout_RDX;
  anon_union_16_2_67f50693_for_value *paVar9;
  undefined1 *extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t len;
  idx_t extraout_RDX_02;
  idx_t extraout_RDX_03;
  buffer_ptr<ValidityBuffer> *pbVar10;
  long lVar11;
  ulong uVar12;
  idx_t idx_in_entry;
  ulong uVar13;
  ulong uVar14;
  data_ptr_t pdVar15;
  ulong uVar16;
  idx_t iVar17;
  idx_t iVar18;
  string_t target_4;
  string_t target;
  anon_union_16_2_67f50693_for_value local_d8;
  buffer_ptr<ValidityBuffer> *local_c0;
  idx_t local_b8;
  data_ptr_t local_b0;
  ulong local_a8;
  anon_union_16_2_67f50693_for_value local_a0;
  ulong local_90;
  Vector *local_88;
  anon_union_16_2_67f50693_for_value local_80;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  reference local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  iVar17 = args->count;
  local_b8 = iVar17;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    local_b0 = result->data;
    pdVar15 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      if (iVar17 != 0) {
        lVar11 = 8;
        iVar18 = extraout_RDX;
        do {
          local_d8.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + lVar11);
          local_d8._0_8_ = *(ulong *)(pdVar15 + lVar11 + -8);
          local_80.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString
                         ((StringVector *)result,
                          (Vector *)(*(ulong *)(pdVar15 + lVar11 + -8) & 0xffffffff),iVar18);
          Bit::BitwiseNot((bitstring_t *)&local_d8.pointer,(bitstring_t *)&local_80.pointer);
          *(undefined8 *)(local_b0 + lVar11 + -8) = local_80._0_8_;
          *(char **)(local_b0 + lVar11 + -8 + 8) = local_80.pointer.ptr;
          lVar11 = lVar11 + 0x10;
          iVar17 = iVar17 - 1;
          iVar18 = extraout_RDX_02;
        } while (iVar17 != 0);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < iVar17 + 0x3f) {
        local_90 = iVar17 + 0x3f >> 6;
        local_a8 = 0;
        uVar14 = 0;
        local_88 = result;
        local_38 = vector;
        do {
          pdVar5 = local_b0;
          puVar1 = (local_38->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar1 == (unsigned_long *)0x0) {
            local_c0 = (buffer_ptr<ValidityBuffer> *)(uVar14 + 0x40);
            if (iVar17 <= uVar14 + 0x40) {
              local_c0 = (buffer_ptr<ValidityBuffer> *)iVar17;
            }
LAB_01bff580:
            pbVar10 = (buffer_ptr<ValidityBuffer> *)uVar14;
            if (uVar14 < local_c0) {
              uVar16 = uVar14 << 4 | 8;
              paVar9 = &local_d8;
              do {
                local_d8.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + uVar16);
                local_d8._0_8_ = *(ulong *)(pdVar15 + (uVar16 - 8));
                local_80.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     StringVector::EmptyString
                               ((StringVector *)result,
                                (Vector *)(*(ulong *)(pdVar15 + (uVar16 - 8)) & 0xffffffff),
                                (idx_t)paVar9);
                Bit::BitwiseNot((bitstring_t *)&local_d8.pointer,(bitstring_t *)&local_80.pointer);
                *(undefined8 *)(pdVar5 + (uVar16 - 8)) = local_80._0_8_;
                *(char **)(pdVar5 + (uVar16 - 8) + 8) = local_80.pointer.ptr;
                uVar14 = uVar14 + 1;
                uVar16 = uVar16 + 0x10;
                paVar9 = (anon_union_16_2_67f50693_for_value *)extraout_RDX_00;
                pbVar10 = local_c0;
                iVar17 = local_b8;
              } while (local_c0 != (buffer_ptr<ValidityBuffer> *)uVar14);
            }
          }
          else {
            uVar16 = puVar1[local_a8];
            local_c0 = (buffer_ptr<ValidityBuffer> *)(uVar14 + 0x40);
            if (iVar17 <= uVar14 + 0x40) {
              local_c0 = (buffer_ptr<ValidityBuffer> *)iVar17;
            }
            pbVar10 = local_c0;
            if (uVar16 != 0) {
              if (uVar16 == 0xffffffffffffffff) goto LAB_01bff580;
              uVar13 = (long)local_c0 - uVar14;
              pbVar10 = (buffer_ptr<ValidityBuffer> *)uVar14;
              iVar17 = local_b8;
              if (uVar14 < local_c0) {
                uVar14 = uVar14 << 4 | 8;
                uVar12 = 0;
                do {
                  if ((uVar16 >> (uVar12 & 0x3f) & 1) != 0) {
                    local_d8.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + uVar14);
                    local_d8._0_8_ = *(ulong *)(pdVar15 + (uVar14 - 8));
                    local_80.pointer =
                         (anon_struct_16_3_d7536bce_for_pointer)
                         StringVector::EmptyString
                                   ((StringVector *)local_88,
                                    (Vector *)(*(ulong *)(pdVar15 + (uVar14 - 8)) & 0xffffffff),
                                    (idx_t)&local_d8);
                    Bit::BitwiseNot((bitstring_t *)&local_d8.pointer,
                                    (bitstring_t *)&local_80.pointer);
                    *(undefined8 *)(local_b0 + (uVar14 - 8)) = local_80._0_8_;
                    *(char **)(local_b0 + (uVar14 - 8) + 8) = local_80.pointer.ptr;
                  }
                  uVar12 = uVar12 + 1;
                  uVar14 = uVar14 + 0x10;
                  pbVar10 = local_c0;
                  result = local_88;
                  iVar17 = local_b8;
                } while (uVar13 != uVar12);
              }
            }
          }
          local_a8 = local_a8 + 1;
          uVar14 = (ulong)pbVar10;
        } while (local_a8 != local_90);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar15 = result->data;
    paVar9 = (anon_union_16_2_67f50693_for_value *)vector->data;
    puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    local_d8 = *paVar9;
    local_80.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::EmptyString
                   ((StringVector *)result,(Vector *)(*(ulong *)paVar9 & 0xffffffff),len);
    Bit::BitwiseNot((bitstring_t *)&local_d8.pointer,(bitstring_t *)&local_80.pointer);
    *(undefined8 *)pdVar15 = local_80._0_8_;
    *(char **)(pdVar15 + 8) = local_80.pointer.ptr;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_80.pointer);
    Vector::ToUnifiedFormat(vector,iVar17,(UnifiedVectorFormat *)&local_80.pointer);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar15 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_70 == 0) {
      if (iVar17 != 0) {
        lVar11 = *(long *)local_80._0_8_;
        pdVar15 = pdVar15 + 8;
        iVar18 = 0;
        iVar17 = extraout_RDX_01;
        do {
          iVar8 = iVar18;
          if (lVar11 != 0) {
            iVar8 = (idx_t)*(uint *)(lVar11 + iVar18 * 4);
          }
          local_a0._0_8_ = *(undefined8 *)(local_80.pointer.ptr + iVar8 * 0x10);
          local_a0.pointer.ptr = (char *)*(undefined8 *)(local_80.pointer.ptr + iVar8 * 0x10 + 8);
          local_d8.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString
                         ((StringVector *)result,(Vector *)(local_a0._0_8_ & 0xffffffff),iVar17);
          Bit::BitwiseNot((bitstring_t *)&local_a0.pointer,(bitstring_t *)&local_d8.pointer);
          *(undefined8 *)(pdVar15 + -8) = local_d8._0_8_;
          *(char **)pdVar15 = local_d8.pointer.ptr;
          iVar18 = iVar18 + 1;
          pdVar15 = pdVar15 + 0x10;
          iVar17 = extraout_RDX_03;
        } while (local_b8 != iVar18);
      }
    }
    else if (iVar17 != 0) {
      lVar11 = *(long *)local_80._0_8_;
      local_c0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      pdVar15 = pdVar15 + 8;
      uVar14 = 0;
      do {
        uVar16 = uVar14;
        if (lVar11 != 0) {
          uVar16 = (ulong)*(uint *)(lVar11 + uVar14 * 4);
        }
        if ((*(ulong *)(local_70 + (uVar16 >> 6) * 8) >> (uVar16 & 0x3f) & 1) == 0) {
          _Var7._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var7._M_head_impl == (unsigned_long *)0x0) {
            local_a0._0_8_ = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_d8.pointer,(unsigned_long *)&local_a0);
            uVar3 = local_d8._0_8_;
            uVar4 = local_d8.pointer.ptr;
            local_d8 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar3;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.pointer.ptr !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.pointer.ptr);
              }
            }
            pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (local_c0);
            _Var7._M_head_impl =
                 (pTVar6->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var7._M_head_impl;
          }
          bVar2 = (byte)uVar14 & 0x3f;
          _Var7._M_head_impl[uVar14 >> 6] =
               _Var7._M_head_impl[uVar14 >> 6] &
               (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
        }
        else {
          local_a0._0_8_ = *(undefined8 *)(local_80.pointer.ptr + uVar16 * 0x10);
          local_a0.pointer.ptr = (char *)*(undefined8 *)(local_80.pointer.ptr + uVar16 * 0x10 + 8);
          local_d8.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString
                         ((StringVector *)result,(Vector *)(local_a0._0_8_ & 0xffffffff),uVar16 >> 6
                         );
          Bit::BitwiseNot((bitstring_t *)&local_a0.pointer,(bitstring_t *)&local_d8.pointer);
          *(undefined8 *)(pdVar15 + -8) = local_d8._0_8_;
          *(char **)pdVar15 = local_d8.pointer.ptr;
        }
        uVar14 = uVar14 + 1;
        pdVar15 = pdVar15 + 0x10;
      } while (local_b8 != uVar14);
    }
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
  }
  return;
}

Assistant:

static void BitwiseNOTOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<string_t, string_t>(args.data[0], result, args.size(), [&](string_t input) {
		string_t target = StringVector::EmptyString(result, input.GetSize());

		Bit::BitwiseNot(input, target);
		return target;
	});
}